

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O3

void render_state_end(render_state_t *state)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  ulong uVar4;
  render_state *prVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  plutovg_rect_t extents;
  plutovg_matrix_t matrix;
  plutovg_rect_t local_40;
  plutovg_matrix_t local_30;
  
  if (((state->mode != render_mode_painting) &&
      (pfVar1 = &(state->extents).w, 0.0 < *pfVar1 || *pfVar1 == 0.0)) &&
     (pfVar1 = &(state->extents).h, 0.0 < *pfVar1 || *pfVar1 == 0.0)) {
    plutovg_matrix_invert(&state->parent->matrix,&local_30);
    plutovg_matrix_multiply(&local_30,&state->matrix,&local_30);
    plutovg_matrix_map_rect(&local_30,&state->extents,&local_40);
    prVar5 = state->parent;
    fVar2 = (prVar5->extents).w;
    if ((fVar2 < 0.0) || (fVar3 = (prVar5->extents).h, fVar3 < 0.0)) {
      (prVar5->extents).x = local_40.x;
      (prVar5->extents).y = local_40.y;
      (prVar5->extents).w = local_40.w;
      (prVar5->extents).h = local_40.h;
    }
    else {
      uVar4._0_4_ = (prVar5->extents).x;
      uVar4._4_4_ = (prVar5->extents).y;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = uVar4;
      auVar7._0_4_ = fVar2 + (float)(undefined4)uVar4;
      auVar7._4_4_ = fVar3 + (float)uVar4._4_4_;
      auVar7._8_8_ = 0;
      auVar8._8_8_ = 0;
      auVar8._0_4_ = local_40.x;
      auVar8._4_4_ = local_40.y;
      auVar9 = minps(auVar9,auVar8);
      auVar6._4_4_ = local_40.h + local_40.y;
      auVar6._0_4_ = local_40.w + local_40.x;
      auVar6._8_8_ = 0;
      auVar8 = maxps(auVar7,auVar6);
      (prVar5->extents).x = (float)(int)auVar9._0_8_;
      (prVar5->extents).y = (float)(int)((ulong)auVar9._0_8_ >> 0x20);
      (prVar5->extents).w = auVar8._0_4_ - auVar9._0_4_;
      (prVar5->extents).h = auVar8._4_4_ - auVar9._4_4_;
    }
  }
  return;
}

Assistant:

static void render_state_end(render_state_t* state)
{
    if(state->mode == render_mode_painting)
        return;
    if(IS_INVALID_RECT(state->extents)) {
        return;
    }

    plutovg_matrix_t matrix;
    plutovg_matrix_invert(&state->parent->matrix, &matrix);
    plutovg_matrix_multiply(&matrix, &state->matrix, &matrix);

    plutovg_rect_t extents;
    plutovg_matrix_map_rect(&matrix, &state->extents, &extents);
    if(IS_INVALID_RECT(state->parent->extents)) {
        state->parent->extents = extents;
        return;
    }

    float l = MIN(state->parent->extents.x, extents.x);
    float t = MIN(state->parent->extents.y, extents.y);
    float r = MAX(state->parent->extents.x + state->parent->extents.w, extents.x + extents.w);
    float b = MAX(state->parent->extents.y + state->parent->extents.h, extents.y + extents.h);

    state->parent->extents.x = l;
    state->parent->extents.y = t;
    state->parent->extents.w = r - l;
    state->parent->extents.h = b - t;
}